

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geometry.cpp
# Opt level: O2

void __thiscall TRM::Vertex::insert_below(Vertex *this,Edge *e)

{
  anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5 *paVar1;
  float fVar2;
  Vertex *pVVar3;
  Vertex *pVVar4;
  Edge *this_00;
  bool bVar5;
  LinkedList<TRM::Edge> *pLVar6;
  Edge **ppEVar7;
  Edge *pEVar8;
  
  pVVar3 = e->top;
  pVVar4 = e->bottom;
  fVar2 = (pVVar3->point).field_0.x;
  if ((fVar2 == (pVVar4->point).field_0.x) && (!NAN(fVar2) && !NAN((pVVar4->point).field_0.x))) {
    fVar2 = (pVVar3->point).field_1.y;
    paVar1 = &(pVVar4->point).field_1;
    if ((fVar2 == paVar1->y) && (!NAN(fVar2) && !NAN(paVar1->y))) {
      return;
    }
  }
  bVar5 = VertexCompare::Compare(&pVVar4->point,&pVVar3->point);
  if (!bVar5) {
    pLVar6 = &this->edge_below;
    pEVar8 = (Edge *)0x0;
    while ((this_00 = pLVar6->head, this_00 != (Edge *)0x0 &&
           (bVar5 = Edge::is_right_of(this_00,&e->bottom->point), !bVar5))) {
      pLVar6 = (LinkedList<TRM::Edge> *)&this_00->below_next;
      pEVar8 = this_00;
    }
    pLVar6 = (LinkedList<TRM::Edge> *)&pEVar8->below_next;
    if (pEVar8 == (Edge *)0x0) {
      pLVar6 = &this->edge_below;
    }
    e->below_prev = pEVar8;
    e->below_next = this_00;
    pLVar6->head = e;
    ppEVar7 = &this_00->below_prev;
    if (this_00 == (Edge *)0x0) {
      ppEVar7 = &(this->edge_below).tail;
    }
    *ppEVar7 = e;
  }
  return;
}

Assistant:

void Vertex::insert_below(Edge* e) {
  if (e->top->point == e->bottom->point ||                     // no edge
      VertexCompare::Compare(e->bottom->point, e->top->point)  // not below
  ) {
    return;
  }

  Edge* below_prev = nullptr;
  Edge* below_next = nullptr;

  for (below_next = edge_below.head; below_next != nullptr;
       below_next = below_next->below_next) {
    if (below_next->is_right_of(e->bottom->point)) {
      break;
    }

    below_prev = below_next;
  }

  LinkedList<Edge>::Insert<&Edge::below_prev, &Edge::below_next>(
      e, below_prev, below_next, &edge_below.head, &edge_below.tail);
}